

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

bool __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
          (Image<float,_gimage::PixelTraits<float>_> *this,long i,long k)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->depth;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    uVar4 = uVar2;
    if (uVar3 == uVar4) break;
    uVar2 = uVar4 + 1;
  } while ((uint)ABS(this->img[uVar4][k][i]) < 0x7f800000);
  return (long)(int)uVar1 <= (long)uVar4;
}

Assistant:

bool isValid(long i, long k) const
    {
      for (int j=0; j<depth; j++)
      {
        if (!isValidS(img[j][k][i]))
        {
          return false;
        }
      }

      return true;
    }